

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_chasm_bin.cpp
# Opt level: O3

void __thiscall FChasmBinFile::DumpFiles(FChasmBinFile *this,char *path)

{
  FResourceLump *pFVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  FILE *__s;
  undefined4 extraout_var;
  size_t __size;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char filename [1024];
  uchar buffer [4096];
  char local_1438 [1024];
  undefined1 local_1038 [4104];
  long *plVar5;
  
  CreatePath(path);
  uVar4 = (ulong)(this->m_lumps).Count;
  if (uVar4 != 0) {
    uVar8 = 0;
    do {
      pFVar1 = (this->m_lumps).Array[uVar8];
      memset(local_1438,0,0x400);
      mysnprintf(local_1438,0x400,"%s/%s",path,(pFVar1->FullName).Chars);
      __s = fopen(local_1438,"wb");
      if (__s != (FILE *)0x0) {
        iVar3 = (*pFVar1->_vptr_FResourceLump[2])(pFVar1);
        plVar5 = (long *)CONCAT44(extraout_var,iVar3);
        if (plVar5 == (long *)0x0) {
          __assert_fail("NULL != reader",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/file_chasm_bin.cpp"
                        ,0x1fd,"void FChasmBinFile::DumpFiles(const char *const)");
        }
        uVar6 = (long)pFVar1->LumpSize;
        if (0 < (long)pFVar1->LumpSize) {
          do {
            uVar7 = 0x1000;
            if (uVar6 < 0x1000) {
              uVar7 = uVar6;
            }
            __size = (**(code **)(*plVar5 + 0x10))(plVar5,local_1038,uVar7);
            fwrite(local_1038,__size,1,__s);
            uVar7 = uVar6 - __size;
            bVar2 = (long)__size <= (long)uVar6;
            uVar6 = uVar7;
          } while (uVar7 != 0 && bVar2);
        }
        fclose(__s);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar4);
  }
  return;
}

Assistant:

void FChasmBinFile::DumpFiles(const char* const path)
{
	CreatePath(path);

	for (DWORD i = 0, count = m_lumps.Size(); i < count; ++i)
	{
		FResourceLump* const lump = m_lumps[i];

		char filename[1024] = {};
		mysnprintf(filename, sizeof filename, "%s/%s", path, lump->FullName.GetChars());

		FILE* const file = fopen(filename, "wb");
		if (NULL == file)
		{
			continue;
		}

		FileReader* reader = lump->GetReader();
		assert(NULL != reader);

		for (long bytesLeft = lump->LumpSize; bytesLeft > 0; /* EMPTY */)
		{
			unsigned char buffer[4096];

			const long bytesToRead = MIN(bytesLeft, long(sizeof buffer));
			const long bytesRead = reader->Read(buffer, bytesToRead);

			fwrite(buffer, bytesRead, 1, file);

			bytesLeft -= bytesRead;
		}

		fclose(file);
	}
}